

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_3>>
::Visit<google::protobuf::EnumDescriptorProto_const>
          (VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__3>>
           *this,EnumDescriptor *descriptor,EnumDescriptorProto *proto)

{
  EnumValueDescriptor *pEVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *proto_00;
  long lVar2;
  long lVar3;
  
  DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::EnumDescriptor>
            (*(DescriptorBuilder **)this,descriptor->file_->edition_,proto,descriptor,
             descriptor->options_,*(FlatAllocator **)(this + 8),NAME,false);
  if (0 < descriptor->value_count_) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      pEVar1 = descriptor->values_;
      proto_00 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                           (&(proto->field_0)._impl_.value_.super_RepeatedPtrFieldBase,(int)lVar3);
      DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::EnumValueDescriptor>
                (*(DescriptorBuilder **)this,
                 *(Edition *)(*(long *)(*(long *)((long)&pEVar1->type_ + lVar2) + 0x10) + 0x20),
                 proto_00,(EnumValueDescriptor *)(&pEVar1->super_SymbolBaseN<0> + lVar2),
                 *(OptionsType **)((long)&pEVar1->options_ + lVar2),*(FlatAllocator **)(this + 8),
                 NAME,false);
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x30;
    } while (lVar3 < descriptor->value_count_);
  }
  return;
}

Assistant:

void Visit(const EnumDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
    for (int i = 0; i < descriptor.value_count(); i++) {
      Visit(*descriptor.value(i), value(proto, i)...);
    }
  }